

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

void surv0_pipe_send_cb(void *arg)

{
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  nni_msg *local_28;
  nni_msg *msg;
  surv0_sock *sock;
  surv0_pipe *p;
  void *arg_local;
  
  msg = *(nni_msg **)((long)arg + 8);
  sock = (surv0_sock *)arg;
  p = (surv0_pipe *)arg;
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x68));
  if (nVar1 == NNG_OK) {
    nni_mtx_lock((nni_mtx *)(msg->m_header_buf + 8));
    if ((sock[3].ctx.recv_lmq.lmq_mask & 0x100) == 0) {
      iVar2 = nni_lmq_get((nni_lmq *)&(sock->pipes).ll_head.ln_prev,&local_28);
      if (iVar2 == 0) {
        nni_aio_set_msg((nni_aio *)&(sock->ctx).recv_lmq.lmq_mask,local_28);
        nni_pipe_send(*(nni_pipe **)sock,(nni_aio *)&(sock->ctx).recv_lmq.lmq_mask);
      }
      else {
        *(undefined1 *)&sock[3].ctx.recv_lmq.lmq_mask = 0;
      }
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
    }
    else {
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
    }
  }
  else {
    m = nni_aio_get_msg((nni_aio *)&(sock->ctx).recv_lmq.lmq_mask);
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)&(sock->ctx).recv_lmq.lmq_mask,(nni_msg *)0x0);
    nni_pipe_close(*(nni_pipe **)sock);
  }
  return;
}

Assistant:

static void
surv0_pipe_send_cb(void *arg)
{
	surv0_pipe *p    = arg;
	surv0_sock *sock = p->sock;
	nni_msg    *msg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	nni_mtx_lock(&sock->mtx);
	if (p->closed) {
		nni_mtx_unlock(&sock->mtx);
		return;
	}
	if (nni_lmq_get(&p->send_queue, &msg) == 0) {
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		p->busy = false;
	}
	nni_mtx_unlock(&sock->mtx);
}